

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O0

ssize_t get_line(uchar *b,ssize_t avail,ssize_t *nlsize)

{
  ssize_t len;
  ssize_t *nlsize_local;
  ssize_t avail_local;
  uchar *b_local;
  
  len = 0;
  b_local = b;
  do {
    if (avail <= len) {
      if (nlsize != (ssize_t *)0x0) {
        *nlsize = 0;
      }
      return avail;
    }
    switch(""[*b_local]) {
    case '\0':
      if (nlsize != (ssize_t *)0x0) {
        *nlsize = 0;
      }
      return -1;
    case '\x01':
      b_local = b_local + 1;
      len = len + 1;
    default:
      break;
    case '\r':
      if ((1 < avail - len) && (b_local[1] == '\n')) {
        if (nlsize != (ssize_t *)0x0) {
          *nlsize = 2;
        }
        return len + 2;
      }
    case '\n':
      if (nlsize != (ssize_t *)0x0) {
        *nlsize = 1;
      }
      return len + 1;
    }
  } while( true );
}

Assistant:

static ssize_t
get_line(const unsigned char *b, ssize_t avail, ssize_t *nlsize)
{
	ssize_t len;

	len = 0;
	while (len < avail) {
		switch (ascii[*b]) {
		case 0:	/* Non-ascii character or control character. */
			if (nlsize != NULL)
				*nlsize = 0;
			return (-1);
		case '\r':
			if (avail-len > 1 && b[1] == '\n') {
				if (nlsize != NULL)
					*nlsize = 2;
				return (len+2);
			}
			/* FALL THROUGH */
		case '\n':
			if (nlsize != NULL)
				*nlsize = 1;
			return (len+1);
		case 1:
			b++;
			len++;
			break;
		}
	}
	if (nlsize != NULL)
		*nlsize = 0;
	return (avail);
}